

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

long __thiscall QByteArray::toLong(QByteArray *this,bool *ok,int base)

{
  long lVar1;
  undefined4 in_EDX;
  bool *in_RSI;
  int in_stack_0000002c;
  undefined1 in_stack_00000030 [16];
  undefined4 in_stack_ffffffffffffffe8;
  
  qToByteArrayViewIgnoringNull<QByteArray,_true>
            ((QByteArray *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  lVar1 = QtPrivate::toIntegral<long,QByteArrayView,void>
                    ((QByteArrayView)in_stack_00000030,in_RSI,in_stack_0000002c);
  return lVar1;
}

Assistant:

long QByteArray::toLong(bool *ok, int base) const
{
    return QtPrivate::toIntegral<long>(qToByteArrayViewIgnoringNull(*this), ok, base);
}